

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[12],unsigned_long,char[40],unsigned_long,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [12],unsigned_long *Args_1,
          char (*Args_2) [40],unsigned_long *Args_3,char (*Args_4) [2])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[12],unsigned_long,char[40],unsigned_long,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [12])this,(unsigned_long *)Args,(char (*) [40])Args_1,(unsigned_long *)Args_2
             ,(char (*) [2])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}